

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O2

void canvas_map(_glist *x,t_floatarg f)

{
  t_gobj *x_00;
  t_selection *ptVar1;
  int iVar2;
  _outconnect *p_Var3;
  undefined4 extraout_var;
  _glist *p_Var4;
  t_symbol *ptVar5;
  ulong uVar6;
  t_gobj **pptVar7;
  t_selection **pptVar8;
  ulong uVar9;
  ulong uVar10;
  char *local_148;
  char *local_140;
  t_linetraverser t;
  char tag [128];
  
  iVar2 = glist_isvisible(x);
  if ((f != 0.0) || (NAN(f))) {
    if (iVar2 == 0) {
      if ((x->field_0xe8 & 1) == 0) {
        bug("canvas_map");
        canvas_vis(x,1.0);
      }
      pptVar7 = &x->gl_list;
      while (x_00 = *pptVar7, x_00 != (t_gobj *)0x0) {
        gobj_vis(x_00,x,1);
        pptVar7 = &x_00->g_next;
      }
      x->field_0xe8 = x->field_0xe8 | 2;
      pptVar8 = &x->gl_editor->e_selection;
      while (ptVar1 = *pptVar8, ptVar1 != (t_selection *)0x0) {
        gobj_select(ptVar1->sel_what,x,1);
        pptVar8 = &ptVar1->sel_next;
      }
      local_148 = tag;
      t.tr_ob = (t_object *)0x0;
      t.tr_nextoc = (_outconnect *)0x0;
      t.tr_nout = 0;
      t.tr_nextoutno = 0;
      local_140 = "cord";
      t.tr_x = x;
      while( true ) {
        p_Var3 = linetraverser_next(&t);
        if (p_Var3 == (_outconnect *)0x0) break;
        iVar2 = sprintf(tag,"l%lx",p_Var3);
        p_Var4 = glist_getcanvas((_glist *)CONCAT44(extraout_var,iVar2));
        iVar2 = t.tr_lx1;
        uVar6 = (ulong)(uint)t.tr_ly1;
        uVar9 = (ulong)(uint)t.tr_lx2;
        uVar10 = (ulong)(uint)t.tr_ly2;
        ptVar5 = outlet_getsymbol(t.tr_outlet);
        pdgui_vmess((char *)0x0,"crr iiii ri rS",p_Var4,"create","line",(ulong)(uint)iVar2,uVar6,
                    uVar9,uVar10,"-width",(ulong)(uint)(x->gl_zoom << (ptVar5 == &s_signal)),"-tags"
                    ,2,&local_148);
      }
      if ((~*(uint *)&x->field_0xe8 & 0x180) == 0) {
        canvas_drawredrect(x,1);
      }
      pdgui_vmess("pdtk_canvas_getscroll","c",x);
    }
  }
  else if (iVar2 != 0) {
    if ((x->field_0xe8 & 1) == 0) {
      bug("canvas_map");
      return;
    }
    pdgui_vmess((char *)0x0,"crs",x,"delete","all");
    x->field_0xe8 = x->field_0xe8 & 0xfd;
  }
  return;
}

Assistant:

void canvas_map(t_canvas *x, t_floatarg f)
{
    int flag = (f != 0);
    t_gobj *y;
    if (flag)
    {
        if (!glist_isvisible(x))
        {
            t_selection *sel;
            if (!x->gl_havewindow)
            {
                bug("canvas_map");
                canvas_vis(x, 1);
            }
            for (y = x->gl_list; y; y = y->g_next)
                gobj_vis(y, x, 1);
            x->gl_mapped = 1;
            for (sel = x->gl_editor->e_selection; sel; sel = sel->sel_next)
                gobj_select(sel->sel_what, x, 1);
            canvas_drawlines(x);
            if (x->gl_isgraph && x->gl_goprect)
                canvas_drawredrect(x, 1);
            pdgui_vmess("pdtk_canvas_getscroll", "c", x);
        }
    }
    else
    {
        if (glist_isvisible(x))
        {
            if (!x->gl_havewindow)
            {
                bug("canvas_map");
                return;
            }
                /* just clear out the whole canvas */
            pdgui_vmess(0, "crs", x, "delete", "all");
            x->gl_mapped = 0;
        }
    }
}